

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.c
# Opt level: O3

void av1_cnn_convolve_no_maxpool_padding_valid_c
               (float **input,int in_width,int in_height,int in_stride,
               CNN_LAYER_CONFIG *layer_config,float **output,int out_stride,int start_idx,int cstep,
               int channel_step)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  float *pfVar8;
  float *pfVar9;
  int k;
  ulong uVar10;
  long lVar11;
  long lVar12;
  int ii;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  float *pfVar17;
  long lVar18;
  int iVar19;
  float fVar20;
  int local_dc;
  long local_d8;
  long local_d0;
  long local_c0;
  long local_b8;
  int local_b0;
  int local_a8;
  
  iVar2 = layer_config->out_channels;
  if (start_idx < iVar2) {
    iVar3 = layer_config->filter_height;
    lVar15 = (long)in_height - (long)iVar3;
    local_d8 = (long)start_idx;
    do {
      local_b0 = (int)lVar15;
      if (-1 < local_b0) {
        iVar4 = layer_config->filter_width;
        lVar11 = (long)in_width - (long)iVar4;
        iVar5 = layer_config->skip_height;
        local_c0 = 0;
        local_dc = 0;
        local_d0 = 0;
        do {
          local_a8 = (int)lVar11;
          if (-1 < local_a8) {
            lVar16 = (long)local_dc;
            pfVar8 = layer_config->bias;
            uVar6 = layer_config->in_channels;
            pfVar9 = output[local_d8];
            iVar7 = layer_config->skip_width;
            local_b8 = local_c0;
            lVar18 = 0;
            do {
              fVar20 = pfVar8[local_d8];
              if (0 < (int)uVar6) {
                uVar10 = 0;
                do {
                  if (0 < iVar3) {
                    iVar19 = (int)local_d8 + (int)uVar10 * iVar2;
                    lVar13 = local_d0;
                    lVar14 = local_b8;
                    do {
                      if (0 < iVar4) {
                        pfVar17 = layer_config->weights + iVar19;
                        lVar12 = 0;
                        do {
                          fVar20 = fVar20 + *pfVar17 *
                                            *(float *)((long)input[uVar10] + lVar12 * 4 + lVar14);
                          pfVar17 = pfVar17 + cstep;
                          iVar19 = iVar19 + cstep;
                          lVar1 = lVar18 + lVar12;
                          lVar12 = lVar12 + 1;
                        } while (lVar1 + 1 < lVar18 + iVar4);
                      }
                      lVar13 = lVar13 + 1;
                      lVar14 = lVar14 + (long)in_stride * 4;
                    } while (lVar13 < local_d0 + iVar3);
                  }
                  uVar10 = uVar10 + 1;
                } while (uVar10 != uVar6);
              }
              pfVar9[lVar16] = fVar20;
              lVar18 = lVar18 + iVar7;
              lVar16 = lVar16 + 1;
              local_b8 = local_b8 + (long)iVar7 * 4;
            } while (lVar18 <= lVar11);
          }
          local_d0 = local_d0 + iVar5;
          local_dc = local_dc + out_stride;
          local_c0 = local_c0 + (long)in_stride * 4 * (long)iVar5;
        } while (local_d0 <= lVar15);
      }
      local_d8 = local_d8 + channel_step;
    } while (local_d8 < iVar2);
  }
  return;
}

Assistant:

void av1_cnn_convolve_no_maxpool_padding_valid_c(
    const float **input, int in_width, int in_height, int in_stride,
    const CNN_LAYER_CONFIG *layer_config, float **output, int out_stride,
    int start_idx, int cstep, int channel_step) {
  assert((layer_config->skip_height == 1 && layer_config->skip_width == 1) ||
         !layer_config->maxpool);
  assert(layer_config->filter_height > 1 || layer_config->filter_width > 1);
  assert(layer_config->pad == PADDING_VALID);
  for (int i = start_idx; i < layer_config->out_channels; i += channel_step) {
    for (int h = 0, u = 0; h < in_height - layer_config->filter_height + 1;
         h += layer_config->skip_height, ++u) {
      const int out_h = u * out_stride;
      const int upper_ii_index = layer_config->filter_height + h;
      for (int w = 0, out_index = out_h;
           w < in_width - layer_config->filter_width + 1;
           w += layer_config->skip_width, ++out_index) {
        const int upper_jj_index = layer_config->filter_width + w;
        float sum = layer_config->bias[i];
        for (int k = 0; k < layer_config->in_channels; ++k) {
          int off = k * layer_config->out_channels + i;
          for (int ii = h; ii < upper_ii_index; ++ii) {
            for (int jj = w; jj < upper_jj_index; ++jj) {
              assert(ii >= 0 && ii < in_height && jj >= 0 && jj < in_width);
              sum += layer_config->weights[off] * input[k][ii * in_stride + jj];
              off += cstep;
            }
          }
        }
        output[i][out_index] = sum;
      }
    }
  }
}